

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_concat(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,int dim)

{
  ggml_tensor *tensor;
  int in_ECX;
  ggml_tensor *in_RDX;
  ggml_tensor *in_RSI;
  ggml_tensor *result;
  int d;
  int64_t ne [4];
  undefined8 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar1;
  long local_48 [5];
  int local_1c;
  ggml_tensor *local_18;
  ggml_tensor *local_10;
  
  if ((-1 < in_ECX) && (in_ECX < 4)) {
    if (in_RSI->type != in_RDX->type) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml.c"
                 ,0x928,"GGML_ASSERT(%s) failed","a->type == b->type");
    }
    iVar1 = 0;
    local_1c = in_ECX;
    local_18 = in_RDX;
    local_10 = in_RSI;
    do {
      if (3 < iVar1) {
        tensor = ggml_new_tensor((ggml_context *)CONCAT44(iVar1,in_stack_ffffffffffffffb0),
                                 (ggml_type)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                                 (int)in_stack_ffffffffffffffa8,(int64_t *)0x14c0d3);
        ggml_set_op_params_i32(tensor,0,local_1c);
        tensor->op = GGML_OP_CONCAT;
        tensor->src[0] = local_10;
        tensor->src[1] = local_18;
        return tensor;
      }
      if (iVar1 == local_1c) {
        local_48[iVar1] = local_10->ne[iVar1] + local_18->ne[iVar1];
      }
      else {
        if (local_10->ne[iVar1] != local_18->ne[iVar1]) {
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml.c"
                     ,0x930,"GGML_ASSERT(%s) failed","a->ne[d] == b->ne[d]");
        }
        local_48[iVar1] = local_10->ne[iVar1];
      }
      iVar1 = iVar1 + 1;
    } while( true );
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml.c"
             ,0x927,"GGML_ASSERT(%s) failed","dim >= 0 && dim < GGML_MAX_DIMS");
}

Assistant:

struct ggml_tensor * ggml_concat(
    struct ggml_context * ctx,
    struct ggml_tensor  * a,
    struct ggml_tensor  * b,
    int                   dim) {
    GGML_ASSERT(dim >= 0 && dim < GGML_MAX_DIMS);
    GGML_ASSERT(a->type == b->type);

    int64_t ne[GGML_MAX_DIMS];
    for (int d = 0; d < GGML_MAX_DIMS; ++d) {
        if (d == dim) {
            ne[d] = a->ne[d] + b->ne[d];
            continue;
        }
        GGML_ASSERT(a->ne[d] == b->ne[d]);
        ne[d] = a->ne[d];
    }

    struct ggml_tensor * result = ggml_new_tensor(ctx, a->type, GGML_MAX_DIMS, ne);

    ggml_set_op_params_i32(result, 0, dim);

    result->op     = GGML_OP_CONCAT;
    result->src[0] = a;
    result->src[1] = b;

    return result;
}